

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

void __thiscall tinyxml2::DynArray<char,_20>::EnsureCapacity(DynArray<char,_20> *this,int cap)

{
  char *__src;
  char *__dest;
  
  if (this->_allocated < cap) {
    __dest = (char *)operator_new__((long)(cap * 2));
    __src = this->_mem;
    memcpy(__dest,__src,(long)this->_size);
    if (__src != (char *)0x0 && __src != this->_pool) {
      operator_delete__(__src);
    }
    this->_mem = __dest;
    this->_allocated = cap * 2;
  }
  return;
}

Assistant:

void EnsureCapacity(int cap)
    {
        TIXMLASSERT(cap > 0);
        if (cap > _allocated) {
            TIXMLASSERT(cap <= INT_MAX / 2);
            const int newAllocated = cap * 2;
            T* newMem = new T[newAllocated];
            TIXMLASSERT(newAllocated >= _size);
            memcpy(
                newMem,
                _mem,
                sizeof(T) * _size); // warning: not using constructors, only works for PODs
            if (_mem != _pool) {
                delete[] _mem;
            }
            _mem = newMem;
            _allocated = newAllocated;
        }
    }